

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void snapshot_after_block_reuse_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  char *val;
  char *key;
  fdb_status s_1;
  fdb_status s;
  fdb_file_info file_info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char keybuf [16];
  int nheaders;
  int low_seq;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  void *in_stack_fffffffffffffcd0;
  FILE *pFVar3;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  fdb_file_info *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  ulong local_1c8;
  fdb_kvs_config *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  fdb_kvs_handle **in_stack_fffffffffffffe60;
  fdb_file_handle *in_stack_fffffffffffffe68;
  fdb_config *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  fdb_file_handle **in_stack_fffffffffffffed8;
  fdb_seqnum_t in_stack_ffffffffffffff50;
  fdb_kvs_handle **in_stack_ffffffffffffff58;
  fdb_kvs_handle *in_stack_ffffffffffffff60;
  char local_78 [24];
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  memleak_start();
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_5c = 0;
  local_60 = 5;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_58 = system("rm -rf  staleblktest* > errorlog.txt");
  fVar1 = fdb_open(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x27f);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x27f,"void snapshot_after_block_reuse_test()");
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe50);
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x281);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x281,"void snapshot_after_block_reuse_test()");
  }
  local_54 = 0;
  do {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       in_stack_fffffffffffffce0,
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd0,
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x28a);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x28a,"void snapshot_after_block_reuse_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                              in_stack_fffffffffffffce0);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x28d);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x28d,"void snapshot_after_block_reuse_test()");
    }
  } while (local_1c8 < 0x1000001);
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffca8,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x292);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x292,"void snapshot_after_block_reuse_test()");
  }
  local_5c = local_54;
  for (local_54 = 0; (int)local_54 < local_60 + 5; local_54 = local_54 + 1) {
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       in_stack_fffffffffffffce0,
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd0,
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x299);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x299,"void snapshot_after_block_reuse_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffca8,'\0');
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x29b);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x29b,"void snapshot_after_block_reuse_test()");
    }
  }
  local_54 = local_5c;
  while (local_54 = local_54 + -1, local_54 != 0) {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       in_stack_fffffffffffffce0,
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       in_stack_fffffffffffffcd0,
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x2a2);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x2a2,"void snapshot_after_block_reuse_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffca8,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2a5);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2a5,"void snapshot_after_block_reuse_test()");
  }
  local_5c = local_5c + 6;
  fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff50);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar3 = _stderr;
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2aa);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2aa,"void snapshot_after_block_reuse_test()");
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffca8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              in_stack_ffffffffffffff50);
    if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x2b0);
      snapshot_after_block_reuse_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_NO_DB_INSTANCE) {
        __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x2b0,"void snapshot_after_block_reuse_test()");
      }
    }
    fVar1 = fdb_kvs_close(in_stack_fffffffffffffca8);
    pFVar3 = _stderr;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffca8);
      pFVar3 = _stderr;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        if (snapshot_after_block_reuse_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","snapshot after block reuse test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","snapshot after block reuse test");
        }
        return;
      }
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x2b5);
      snapshot_after_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x2b5,"void snapshot_after_block_reuse_test()");
    }
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2b3);
    snapshot_after_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2b3,"void snapshot_after_block_reuse_test()");
  }
  pFVar3 = _stderr;
  pcVar2 = fdb_error_msg(fVar1);
  fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x2ac);
  snapshot_after_block_reuse_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x2ac,"void snapshot_after_block_reuse_test()");
}

Assistant:

void snapshot_after_block_reuse_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create nheaders
    for (i = 0; i < nheaders + 5; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot on lowest seqno available
    low_seq += 6;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // open snapshot using seqno already reclaimed
    status = fdb_snapshot_open(db, &snap_db, low_seq-1);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("snapshot after block reuse test");
}